

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O0

void start_pass_phuff(j_compress_ptr cinfo,boolean gather_statistics)

{
  long lVar1;
  long lVar2;
  int iVar3;
  undefined8 uVar4;
  int in_ESI;
  long *in_RDI;
  bool bVar5;
  jpeg_component_info *compptr;
  int tbl;
  int ci;
  boolean is_DC_band;
  phuff_entropy_ptr entropy;
  c_derived_tbl **in_stack_00000510;
  int in_stack_00000518;
  boolean in_stack_0000051c;
  j_compress_ptr in_stack_00000520;
  int local_24;
  int local_20;
  
  lVar1 = in_RDI[0x3e];
  *(long **)(lVar1 + 0x50) = in_RDI;
  *(int *)(lVar1 + 0x28) = in_ESI;
  bVar5 = *(int *)((long)in_RDI + 0x19c) != 0;
  if (*(int *)((long)in_RDI + 0x1a4) == 0) {
    if (bVar5) {
      *(code **)(lVar1 + 8) = encode_mcu_AC_first;
    }
    else {
      *(code **)(lVar1 + 8) = encode_mcu_DC_first;
    }
    iVar3 = jsimd_can_encode_mcu_AC_first_prepare();
    if (iVar3 == 0) {
      *(code **)(lVar1 + 0x18) = encode_mcu_AC_first_prepare;
    }
    else {
      *(code **)(lVar1 + 0x18) = jsimd_encode_mcu_AC_first_prepare;
    }
  }
  else if (bVar5) {
    *(code **)(lVar1 + 8) = encode_mcu_AC_refine;
    iVar3 = jsimd_can_encode_mcu_AC_refine_prepare();
    if (iVar3 == 0) {
      *(code **)(lVar1 + 0x20) = encode_mcu_AC_refine_prepare;
    }
    else {
      *(code **)(lVar1 + 0x20) = jsimd_encode_mcu_AC_refine_prepare;
    }
    if (*(long *)(lVar1 + 0x78) == 0) {
      uVar4 = (**(code **)in_RDI[1])(in_RDI,1,1000);
      *(undefined8 *)(lVar1 + 0x78) = uVar4;
    }
  }
  else {
    *(code **)(lVar1 + 8) = encode_mcu_DC_refine;
  }
  if (in_ESI == 0) {
    *(code **)(lVar1 + 0x10) = finish_pass_phuff;
  }
  else {
    *(code **)(lVar1 + 0x10) = finish_pass_gather_phuff;
  }
  local_20 = 0;
  do {
    if (*(int *)((long)in_RDI + 0x144) <= local_20) {
      *(undefined4 *)(lVar1 + 0x6c) = 0;
      *(undefined4 *)(lVar1 + 0x70) = 0;
      *(undefined8 *)(lVar1 + 0x40) = 0;
      *(undefined4 *)(lVar1 + 0x48) = 0;
      *(int *)(lVar1 + 0x80) = (int)in_RDI[0x23];
      *(undefined4 *)(lVar1 + 0x84) = 0;
      return;
    }
    lVar2 = in_RDI[(long)local_20 + 0x29];
    *(undefined4 *)(lVar1 + 0x58 + (long)local_20 * 4) = 0;
    if (bVar5) {
      local_24 = *(int *)(lVar2 + 0x18);
      *(int *)(lVar1 + 0x68) = local_24;
LAB_00114651:
      if (in_ESI == 0) {
        jpeg_make_c_derived_tbl
                  (in_stack_00000520,in_stack_0000051c,in_stack_00000518,in_stack_00000510);
      }
      else {
        if ((local_24 < 0) || (3 < local_24)) {
          *(undefined4 *)(*in_RDI + 0x28) = 0x32;
          *(int *)(*in_RDI + 0x2c) = local_24;
          (**(code **)*in_RDI)(in_RDI);
        }
        if (*(long *)(lVar1 + 0xa8 + (long)local_24 * 8) == 0) {
          uVar4 = (**(code **)in_RDI[1])(in_RDI,1,0x808);
          *(undefined8 *)(lVar1 + 0xa8 + (long)local_24 * 8) = uVar4;
        }
        memset(*(void **)(lVar1 + 0xa8 + (long)local_24 * 8),0,0x808);
      }
    }
    else if (*(int *)((long)in_RDI + 0x1a4) == 0) {
      local_24 = *(int *)(lVar2 + 0x14);
      goto LAB_00114651;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

METHODDEF(void)
start_pass_phuff(j_compress_ptr cinfo, boolean gather_statistics)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  boolean is_DC_band;
  int ci, tbl;
  jpeg_component_info *compptr;

  entropy->cinfo = cinfo;
  entropy->gather_statistics = gather_statistics;

  is_DC_band = (cinfo->Ss == 0);

  /* We assume jcmaster.c already validated the scan parameters. */

  /* Select execution routines */
  if (cinfo->Ah == 0) {
    if (is_DC_band)
      entropy->pub.encode_mcu = encode_mcu_DC_first;
    else
      entropy->pub.encode_mcu = encode_mcu_AC_first;
    if (jsimd_can_encode_mcu_AC_first_prepare())
      entropy->AC_first_prepare = jsimd_encode_mcu_AC_first_prepare;
    else
      entropy->AC_first_prepare = encode_mcu_AC_first_prepare;
  } else {
    if (is_DC_band)
      entropy->pub.encode_mcu = encode_mcu_DC_refine;
    else {
      entropy->pub.encode_mcu = encode_mcu_AC_refine;
      if (jsimd_can_encode_mcu_AC_refine_prepare())
        entropy->AC_refine_prepare = jsimd_encode_mcu_AC_refine_prepare;
      else
        entropy->AC_refine_prepare = encode_mcu_AC_refine_prepare;
      /* AC refinement needs a correction bit buffer */
      if (entropy->bit_buffer == NULL)
        entropy->bit_buffer = (char *)
          (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                      MAX_CORR_BITS * sizeof(char));
    }
  }
  if (gather_statistics)
    entropy->pub.finish_pass = finish_pass_gather_phuff;
  else
    entropy->pub.finish_pass = finish_pass_phuff;

  /* Only DC coefficients may be interleaved, so cinfo->comps_in_scan = 1
   * for AC coefficients.
   */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    /* Initialize DC predictions to 0 */
    entropy->last_dc_val[ci] = 0;
    /* Get table index */
    if (is_DC_band) {
      if (cinfo->Ah != 0)       /* DC refinement needs no table */
        continue;
      tbl = compptr->dc_tbl_no;
    } else {
      entropy->ac_tbl_no = tbl = compptr->ac_tbl_no;
    }
    if (gather_statistics) {
      /* Check for invalid table index */
      /* (make_c_derived_tbl does this in the other path) */
      if (tbl < 0 || tbl >= NUM_HUFF_TBLS)
        ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, tbl);
      /* Allocate and zero the statistics tables */
      /* Note that jpeg_gen_optimal_table expects 257 entries in each table! */
      if (entropy->count_ptrs[tbl] == NULL)
        entropy->count_ptrs[tbl] = (long *)
          (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                      257 * sizeof(long));
      MEMZERO(entropy->count_ptrs[tbl], 257 * sizeof(long));
    } else {
      /* Compute derived values for Huffman table */
      /* We may do this more than once for a table, but it's not expensive */
      jpeg_make_c_derived_tbl(cinfo, is_DC_band, tbl,
                              &entropy->derived_tbls[tbl]);
    }
  }

  /* Initialize AC stuff */
  entropy->EOBRUN = 0;
  entropy->BE = 0;

  /* Initialize bit buffer to empty */
  entropy->put_buffer = 0;
  entropy->put_bits = 0;

  /* Initialize restart stuff */
  entropy->restarts_to_go = cinfo->restart_interval;
  entropy->next_restart_num = 0;
}